

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::CreateFunction(SQCompiler *this,SQObject *name,bool lambda)

{
  SQUnsignedInteger *pSVar1;
  SQLexer *this_00;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQFuncState *pSVar5;
  SQFuncState *this_01;
  ulong uVar6;
  ulong uVar7;
  SQUnsignedInteger SVar8;
  SQFuncState *this_02;
  SQInteger SVar9;
  SQObjectPtr *pSVar10;
  undefined7 in_register_00000011;
  long lVar11;
  SQUnsignedInteger SVar12;
  SQObject SVar13;
  SQObject local_58;
  undefined4 local_44;
  SQObject local_40;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,lambda);
  this_02 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  SVar2 = (this_02->_name).super_SQObject._type;
  pSVar4 = (this_02->_name).super_SQObject._unVal.pTable;
  (this_02->_name).super_SQObject._unVal = name->_unVal;
  SVar3 = name->_type;
  (this_02->_name).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this_02->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  SVar13 = SQFuncState::CreateString(this->_fs,"this",-1);
  local_58._unVal = SVar13._unVal;
  local_58._type = SVar13._type;
  SQFuncState::AddParameter(this_02,&local_58);
  SVar2 = (this_02->_sourcename).super_SQObject._type;
  pSVar4 = (this_02->_sourcename).super_SQObject._unVal.pTable;
  (this_02->_sourcename).super_SQObject._unVal = (this->_sourcename).super_SQObject._unVal;
  SVar3 = (this->_sourcename).super_SQObject._type;
  (this_02->_sourcename).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this_02->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this_00 = &this->_lex;
  lVar11 = 0;
  do {
    if (this->_token == 0x29) {
LAB_00112673:
      Expect(this,0x29);
      if (0 < lVar11) {
        do {
          SQFuncState::PopTarget(this->_fs);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pSVar5 = this->_fs;
      this->_fs = this_02;
      if ((char)local_44 == '\0') {
        Statement(this,false);
      }
      else {
        Expression(this);
        this_01 = this->_fs;
        SVar9 = SQFuncState::PopTarget(this_01);
        local_58._4_4_ = 0x117;
        local_58._type = (SQObjectType)SVar9;
        SQFuncState::AddInstruction(this_01,(SQInstruction *)&local_58);
      }
      SQFuncState::AddLineInfos
                (this_02,(&(this->_lex)._currentline)[(this->_lex)._prevtoken == 10],this->_lineinfo
                 ,true);
      local_58._type = 0;
      local_58._4_4_ = 0xff17;
      SQFuncState::AddInstruction(this_02,(SQInstruction *)&local_58);
      SQFuncState::SetStackSize(this_02,0);
      local_58._unVal.pFunctionProto = SQFuncState::BuildProto(this_02);
      this->_fs = pSVar5;
      local_58._type = OT_FUNCPROTO;
      pSVar1 = &((local_58._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 + 1;
      uVar6 = (pSVar5->_functions)._size;
      uVar7 = (pSVar5->_functions)._allocated;
      if (uVar7 <= uVar6) {
        SVar8 = uVar6 * 2;
        SVar12 = 4;
        if (SVar8 != 0) {
          SVar12 = SVar8;
        }
        pSVar10 = (SQObjectPtr *)sq_vm_realloc((pSVar5->_functions)._vals,uVar7 << 4,SVar12 << 4);
        (pSVar5->_functions)._vals = pSVar10;
        (pSVar5->_functions)._allocated = SVar12;
      }
      pSVar10 = (pSVar5->_functions)._vals;
      SVar8 = (pSVar5->_functions)._size;
      (pSVar5->_functions)._size = SVar8 + 1;
      pSVar10[SVar8].super_SQObject._type = local_58._type;
      pSVar10[SVar8].super_SQObject._unVal.pFunctionProto = (SQFunctionProto *)local_58._unVal;
      if ((local_58._type >> 0x1b & 1) != 0) {
        pSVar1 = &((pSVar10[SVar8].super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
      SQFuncState::PopChildState(this->_fs);
      return;
    }
    if (this->_token == 0x138) {
      if (0 < lVar11) {
        Error(this,"function with default parameters cannot have variable number of parameters");
      }
      SVar13 = SQFuncState::CreateString(this->_fs,"vargv",-1);
      local_58._unVal = SVar13._unVal;
      local_58._type = SVar13._type;
      SQFuncState::AddParameter(this_02,&local_58);
      this_02->_varparams = true;
      SVar9 = SQLexer::Lex(this_00);
      this->_token = SVar9;
      if (SVar9 != 0x29) {
        Error(this,"expected \')\'");
      }
      goto LAB_00112673;
    }
    SVar13 = Expect(this,0x102);
    local_40._unVal = SVar13._unVal;
    local_40._type = SVar13._type;
    SQFuncState::AddParameter(this_02,&local_40);
    if (this->_token == 0x3d) {
      SVar9 = SQLexer::Lex(this_00);
      this->_token = SVar9;
      Expression(this);
      SVar9 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddDefaultParam(this_02,SVar9);
      lVar11 = lVar11 + 1;
    }
    else if (0 < lVar11) {
      Error(this,"expected \'=\'");
    }
    if (this->_token != 0x29) {
      if (this->_token == 0x2c) {
        SVar9 = SQLexer::Lex(this_00);
        this->_token = SVar9;
      }
      else {
        Error(this,"expected \')\' or \',\'");
      }
    }
  } while( true );
}

Assistant:

void CreateFunction(SQObject &name,bool lambda = false)
    {
        SQFuncState *funcstate = _fs->PushChildState(_ss(_vm));
        funcstate->_name = name;
        SQObject paramname;
        funcstate->AddParameter(_fs->CreateString(_SC("this")));
        funcstate->_sourcename = _sourcename;
        SQInteger defparams = 0;
        while(_token!=_SC(')')) {
            if(_token == TK_VARPARAMS) {
                if(defparams > 0) Error(_SC("function with default parameters cannot have variable number of parameters"));
                funcstate->AddParameter(_fs->CreateString(_SC("vargv")));
                funcstate->_varparams = true;
                Lex();
                if(_token != _SC(')')) Error(_SC("expected ')'"));
                break;
            }
            else {
                paramname = Expect(TK_IDENTIFIER);
                funcstate->AddParameter(paramname);
                if(_token == _SC('=')) {
                    Lex();
                    Expression();
                    funcstate->AddDefaultParam(_fs->TopTarget());
                    defparams++;
                }
                else {
                    if(defparams > 0) Error(_SC("expected '='"));
                }
                if(_token == _SC(',')) Lex();
                else if(_token != _SC(')')) Error(_SC("expected ')' or ','"));
            }
        }
        Expect(_SC(')'));
        for(SQInteger n = 0; n < defparams; n++) {
            _fs->PopTarget();
        }

        SQFuncState *currchunk = _fs;
        _fs = funcstate;
        if(lambda) {
            Expression();
            _fs->AddInstruction(_OP_RETURN, 1, _fs->PopTarget());}
        else {
            Statement(false);
        }
        funcstate->AddLineInfos(_lex._prevtoken == _SC('\n')?_lex._lasttokenline:_lex._currentline, _lineinfo, true);
        funcstate->AddInstruction(_OP_RETURN, -1);
        funcstate->SetStackSize(0);

        SQFunctionProto *func = funcstate->BuildProto();
#ifdef _DEBUG_DUMP
        funcstate->Dump(func);
#endif
        _fs = currchunk;
        _fs->_functions.push_back(func);
        _fs->PopChildState();
    }